

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  _Elt_pointer piVar1;
  size_t sVar2;
  bool bVar3;
  char c;
  int n;
  stack<int> s;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s1;
  
  CP::stack<int>::stack(&s);
  __isoc99_scanf("%c",&c);
  do {
    switch(c) {
    case 'm':
    case 'r':
switchD_0010132a_caseD_6d:
      __isoc99_scanf("%d",&n);
      if (c == 'r') {
        CP::stack<int>::remove_top(&s1,&s,(long)n);
        printf("remove_top Result: Size = %d Data =",s.mSize & 0xffffffff);
        while (s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_cur !=
               s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_start._M_cur) {
          piVar1 = s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                   _M_finish._M_cur;
          if (s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_cur ==
              s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_first) {
            piVar1 = s1.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          printf(" %d",(ulong)(uint)piVar1[-1]);
          std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&s1);
        }
        putchar(10);
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)&s1);
      }
      else if (c == 'm') {
        bVar3 = (ulong)(long)n <= s.mSize;
        sVar2 = s.mSize - (long)n;
        s.mSize = 0;
        if (bVar3) {
          s.mSize = sVar2;
        }
      }
      else if (c == 'a') {
        CP::stack<int>::push(&s,&n);
      }
      break;
    case 'n':
    case 'o':
      break;
    case 'p':
      CP::stack<int>::print(&s);
      break;
    case 'q':
      CP::stack<int>::~stack(&s);
      return 0;
    default:
      if (c == 'd') {
        CP::stack<int>::pop(&s);
      }
      else if (c == 'a') goto switchD_0010132a_caseD_6d;
    }
    __isoc99_scanf("%c",&c);
  } while( true );
}

Assistant:

int main() {
  CP::stack<int> s;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'm' || c == 'r') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        s.push(n);
      } else if (c == 'm') {
        s.multi_pop(n);
      } else if (c == 'r') {
        auto s1 = s.remove_top(n);
        printf("remove_top Result: Size = %d Data =",(int)s.size());
        while (s1.empty() == false) {
          printf(" %d",s1.top()); s1.pop();
        }
        printf("\n");
      }
    } else if (c == 'd') {
       s.pop();
    } else if (c == 'p') {
      s.print();
    }
    scanf("%c", &c);
  }
  return 0;
}